

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Expression * __thiscall soul::StructuralParser::parseAdditionSubtraction(StructuralParser *this)

{
  double *pdVar1;
  bool bVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  pool_ref<soul::AST::Expression> local_b8;
  char *local_b0;
  Op local_a4;
  undefined1 local_a0 [4];
  Op type;
  Context context;
  undefined1 local_80 [8];
  Context context_1;
  pool_ref<soul::AST::Expression> local_18;
  pool_ref<soul::AST::Expression> a;
  StructuralParser *this_local;
  
  a.object = (Expression *)this;
  pEVar3 = parseMultiplyDivide(this);
  pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Expression,void>(&local_18,pEVar3);
  do {
    while (bVar2 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                   ::matchesAny<soul::TokenType,soul::TokenType>
                             ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                               *)this,(TokenType)0x54ca4e,(TokenType)0x56f2f2), bVar2) {
      getContext((Context *)local_a0,this);
      local_b0 = (char *)Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                         ::skip(&this->super_SOULTokeniser);
      local_a4 = getBinaryOpForToken((TokenType)local_b0);
      pEVar3 = pool_ref::operator_cast_to_Expression_((pool_ref *)&local_18);
      pEVar4 = parseMultiplyDivide(this);
      pEVar3 = createBinaryOperator(this,(Context *)local_a0,pEVar3,pEVar4,local_a4);
      pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Expression,void>(&local_b8,pEVar3);
      local_18.object = local_b8.object;
      pool_ref<soul::AST::Expression>::~pool_ref(&local_b8);
      AST::Context::~Context((Context *)local_a0);
    }
    bVar2 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
            ::matchesAny<soul::TokenType,soul::TokenType>
                      ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                        *)this,(TokenType)"$integer32",(TokenType)"$integer64");
    if ((!bVar2) || (-1 < (this->super_SOULTokeniser).literalIntValue)) {
      context_1.parentScope = (Scope *)anon_var_dwarf_10ee54;
      bVar2 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
              ::matchesAny<soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType>
                        ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                          *)this,(TokenType)"$float64",(TokenType)"$float32",(TokenType)"$imag32",
                         (TokenType)"$imag64");
      if ((!bVar2) ||
         (pdVar1 = &(this->super_SOULTokeniser).literalDoubleValue, 0.0 < *pdVar1 || *pdVar1 == 0.0)
         ) {
        pEVar3 = pool_ref::operator_cast_to_Expression_((pool_ref *)&local_18);
        pool_ref<soul::AST::Expression>::~pool_ref(&local_18);
        return pEVar3;
      }
    }
    getContext((Context *)local_80,this);
    pEVar3 = pool_ref::operator_cast_to_Expression_((pool_ref *)&local_18);
    pEVar4 = parseMultiplyDivide(this);
    pEVar3 = createBinaryOperator(this,(Context *)local_80,pEVar3,pEVar4,add);
    pool_ref<soul::AST::Expression>::pool_ref<soul::AST::Expression,void>
              ((pool_ref<soul::AST::Expression> *)&context.parentScope,pEVar3);
    local_18.object = (Expression *)context.parentScope;
    pool_ref<soul::AST::Expression>::~pool_ref
              ((pool_ref<soul::AST::Expression> *)&context.parentScope);
    AST::Context::~Context((Context *)local_80);
  } while( true );
}

Assistant:

AST::Expression& parseAdditionSubtraction()
    {
        for (pool_ref<AST::Expression> a = parseMultiplyDivide();;)
        {
            if (! matchesAny (Operator::plus, Operator::minus))
            {
                // Handle the annoying case where some sloppy coder has written a
                // minus sign without a space after it, e.g. (x -1)
                if ((matchesAny (Token::literalInt32, Token::literalInt64) && literalIntValue < 0)
                     || (matchesAny (Token::literalFloat64, Token::literalFloat32, Token::literalImag32, Token::literalImag64) && literalDoubleValue < 0))
                {
                    auto context = getContext();
                    a = createBinaryOperator (context, a, parseMultiplyDivide(), BinaryOp::Op::add);
                    continue;
                }

                return a;
            }

            auto context = getContext();
            auto type = getBinaryOpForToken (skip());
            a = createBinaryOperator (context, a, parseMultiplyDivide(), type);
        }
    }